

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_hooktask.cc
# Opt level: O0

void HookTask::finish(search *sch)

{
  task_data *ptVar1;
  search *in_RDI;
  task_data *td;
  
  ptVar1 = Search::search::get_task_data<HookTask::task_data>(in_RDI);
  if (ptVar1->delete_run_object != (_func_void_void_ptr *)0x0) {
    if (ptVar1->run_object != (void *)0x0) {
      (*ptVar1->delete_run_object)(ptVar1->run_object);
    }
    if (ptVar1->setup_object != (void *)0x0) {
      (*ptVar1->delete_run_object)(ptVar1->setup_object);
    }
    if (ptVar1->takedown_object != (void *)0x0) {
      (*ptVar1->delete_run_object)(ptVar1->takedown_object);
    }
  }
  if (ptVar1->delete_extra_data != (_func_void_task_data_ptr *)0x0) {
    (*ptVar1->delete_extra_data)(ptVar1);
  }
  if (ptVar1 != (task_data *)0x0) {
    operator_delete(ptVar1);
  }
  return;
}

Assistant:

void finish(Search::search& sch)
{
  task_data* td = sch.get_task_data<task_data>();
  if (td->delete_run_object)
  {
    if (td->run_object)
      td->delete_run_object(td->run_object);
    if (td->setup_object)
      td->delete_run_object(td->setup_object);
    if (td->takedown_object)
      td->delete_run_object(td->takedown_object);
  }
  if (td->delete_extra_data)
    td->delete_extra_data(*td);
  delete td;
}